

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void hash_table_increase_free_buckets(hash_table_t *table)

{
  uint uVar1;
  hash_table_bucket_t *phVar2;
  hash_table_bucket_t *new_buckets;
  uint n;
  uint i;
  hash_table_t *table_local;
  
  uVar1 = table->n_buckets;
  phVar2 = (hash_table_bucket_t *)calloc((ulong)uVar1,0x10);
  if (phVar2 == (hash_table_bucket_t *)0x0) {
    fprintf(_stderr,"hash_table_increase_free_buckets: insufficient memory\n");
    abort();
  }
  phVar2->next = table->allocs;
  table->allocs = phVar2;
  for (new_buckets._4_4_ = 1; new_buckets._4_4_ < uVar1 - 1;
      new_buckets._4_4_ = new_buckets._4_4_ + 1) {
    phVar2[new_buckets._4_4_].next = phVar2 + (new_buckets._4_4_ + 1);
    phVar2[new_buckets._4_4_].data = (void *)0x0;
  }
  phVar2[uVar1 - 1].next = table->free_buckets;
  phVar2[uVar1 - 1].data = (void *)0x0;
  table->free_buckets = phVar2 + 1;
  return;
}

Assistant:

static void hash_table_increase_free_buckets( hash_table_t * table )
{
    unsigned i, n = table->n_buckets;
    hash_table_bucket_t * new_buckets = 
        calloc( n, sizeof(hash_table_bucket_t) );
    if (!new_buckets) {
        fprintf(stderr, "hash_table_increase_free_buckets: "
                "insufficient memory\n");
        abort();
    }

    new_buckets->next = table->allocs;
    table->allocs = new_buckets;

    /* assign to free list */
    for ( i = 1; i < n - 1; ++i ) {
        new_buckets[i].next = &new_buckets[i+1];
        new_buckets[i].data = NULL;
    } 
    new_buckets[n-1].next = table->free_buckets;
    new_buckets[n-1].data = NULL;
    table->free_buckets = &new_buckets[1];
}